

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>
::DoCvtWithExprs(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>
                 *this)

{
  ConstraintAcceptanceLevel CVar1;
  ExpressionAcceptanceLevel EVar2;
  anon_class_16_3_c11e61a9 fn;
  
  CVar1 = BasicConstraintKeeper::GetChosenAcceptanceLevel(&this->super_BasicConstraintKeeper);
  EVar2 = BasicConstraintKeeper::GetChosenAcceptanceLevelEXPR(&this->super_BasicConstraintKeeper);
  fn.eal = EVar2;
  fn.cal = CVar1;
  fn.this = this;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
  ::
  ForEachActive<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>::DoCvtWithExprs()::_lambda(auto:1_const&,int)_1_>
            ((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
              *)this,fn);
  return;
}

Assistant:

void DoCvtWithExprs() {
    // For acc:_all=0 to work, we have to accept non-convertible con types
    auto cal = IfConverterConverts(GetConverter())
                   ? GetChosenAcceptanceLevel()
                   : ConstraintAcceptanceLevel::Recommended;
    auto eal = GetChosenAcceptanceLevelEXPR();
    ForEachActive(
        [this, cal, eal](const auto& con, int i) {
          return this->GetConverter().ConvertWithExpressions(con, i, cal, eal);
        });
  }